

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O0

Value * __thiscall iqxmlrpc::Struct::operator[](Struct *this,string *f)

{
  bool bVar1;
  No_field *this_00;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  const_iterator i;
  string *f_local;
  Struct *this_local;
  
  i._M_node = (_Base_ptr)f;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>_>
       ::find(&this->values,f);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>_>
       ::end(&this->values);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
             ::operator->(&local_20);
    return ppVar2->second;
  }
  this_00 = (No_field *)__cxa_allocate_exception(0x18);
  No_field::No_field(this_00,(string *)i._M_node);
  __cxa_throw(this_00,&No_field::typeinfo,No_field::~No_field);
}

Assistant:

const Value& Struct::operator []( const std::string& f ) const
{
  const_iterator i = values.find(f);

  if( i == values.end() )
    throw No_field( f );

  return (*i->second);
}